

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::
InternalFeatureHelperTest_GetResolvedSourceFeatureExtensionEditedDefaults_Test::TestBody
          (InternalFeatureHelperTest_GetResolvedSourceFeatureExtensionEditedDefaults_Test *this)

{
  DescriptorPool *spec;
  long lVar1;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
  *extension;
  ulong uVar2;
  pointer *__ptr_1;
  _Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  __ptr_00;
  AssertHelper *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer pcVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  string_view schema;
  Metadata MVar5;
  FileDescriptor *file;
  FeatureSetDefaults defaults;
  undefined1 local_148 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  _Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  local_138;
  AssertHelper local_130;
  undefined1 local_128 [8];
  undefined1 local_120 [8];
  _Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  local_118;
  anon_union_76_1_493b367e_for_TestFeatures_3 local_110;
  FeatureSetDefaults local_c0;
  FeatureSetDefaults local_88;
  FeatureSetDefaults local_50;
  
  this_00 = (AssertHelper *)local_148;
  local_120 = (undefined1  [8])0x41a;
  local_118._M_head_impl =
       (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x111851c;
  ParseTextOrDie::operator_cast_to_FeatureSetDefaults(&local_50,(ParseTextOrDie *)local_120);
  FeatureSetDefaults::FeatureSetDefaults(&local_88,(Arena *)0x0,&local_50);
  spec = &(this->super_InternalFeatureHelperTest).pool_;
  DescriptorPool::SetFeatureSetDefaults((DescriptorPool *)local_120,(FeatureSetDefaults *)spec);
  local_140._M_head_impl._0_1_ = (internal)(local_120 == (undefined1  [8])0x1);
  local_138._M_head_impl =
       (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0;
  if (((ulong)local_120 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_120);
  }
  this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_138;
  FeatureSetDefaults::~FeatureSetDefaults(&local_88);
  if (local_140._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    FeatureSetDefaults::FeatureSetDefaults(&local_c0,(Arena *)0x0,&local_50);
    DescriptorPool::SetFeatureSetDefaults((DescriptorPool *)local_148,(FeatureSetDefaults *)spec);
    lVar1 = CONCAT44(local_148._4_4_,local_148._0_4_);
    if ((local_148._0_4_ & VALUE1) == TEST_ENUM_FEATURE_UNKNOWN) {
      pcVar4 = *(char **)(lVar1 + 8);
      uVar2 = *(ulong *)(lVar1 + 0x10);
    }
    else {
      uVar2 = (ulong)((uint)((lVar1 << 0x3e) >> 0x3f) & 0x1b);
      pcVar4 = (char *)((lVar1 << 0x3e) >> 0x3f & 0x10e15d0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_128 + 0x10),pcVar4,uVar2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_120,(internal *)&local_140,
               (AssertionResult *)"pool_.SetFeatureSetDefaults(defaults).ok()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
               ,0x99,(char *)local_120);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120 != (undefined1  [8])&local_110) {
      operator_delete((void *)local_120,(ulong)(local_110._0_8_ + 1));
    }
    if ((local_148._0_4_ & VALUE1) == TEST_ENUM_FEATURE_UNKNOWN) {
      absl::lts_20250127::status_internal::StatusRep::Unref
                ((StatusRep *)CONCAT44(local_148._4_4_,local_148._0_4_));
    }
    FeatureSetDefaults::~FeatureSetDefaults(&local_c0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_128 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
    __ptr_00._M_head_impl = local_138._M_head_impl;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0074f437;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138._M_head_impl);
    }
    MVar5 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
    local_140._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InternalFeatureHelperTest::BuildFile
                   (&this->super_InternalFeatureHelperTest,(MVar5.descriptor)->file_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>::
    operator()(local_120,local_128,
               (FileDescriptor **)"BuildFile(DescriptorProto::descriptor()->file())");
    if (local_120[0] == '\0') {
      testing::Message::Message((Message *)&local_140);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_118._M_head_impl ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = ((_Alloc_hider *)&(local_118._M_head_impl)->field_0x0)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                 ,0x9b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_140);
LAB_0074f409:
      this_00 = (AssertHelper *)local_128;
    }
    else {
      if ((_Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
           )local_118._M_head_impl !=
          (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_118._M_head_impl);
      }
      MVar5 = pb::TestMessage::GetMetadata((TestMessage *)pb::_TestMessage_default_instance_);
      local_140._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           InternalFeatureHelperTest::BuildFile
                     (&this->super_InternalFeatureHelperTest,(MVar5.descriptor)->file_);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
      ::operator()(local_120,local_128,
                   (FileDescriptor **)"BuildFile(pb::TestMessage::descriptor()->file())");
      if (local_120[0] == '\0') {
        testing::Message::Message((Message *)&local_140);
        if ((_Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
             )local_118._M_head_impl ==
            (_Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
             )0x0) {
          pcVar3 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar3 = ((_Alloc_hider *)&(local_118._M_head_impl)->field_0x0)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                   ,0x9c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)&local_140);
        goto LAB_0074f409;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_118._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_118._M_head_impl);
      }
      schema._M_str =
           "\n    edition = \"2023\";\n    package proto2_unittest;\n\n    import \"google/protobuf/unittest_features.proto\";\n\n    option features.(pb.test).file_feature = VALUE6;\n    option features.(pb.test).source_feature = VALUE5;\n  "
      ;
      schema._M_len = 0xda;
      local_128 = (undefined1  [8])
                  InternalFeatureHelperTest::BuildFile
                            (&this->super_InternalFeatureHelperTest,schema);
      extension = (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                   *)local_128;
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::NotNullMatcher>>
      ::operator()(local_120,(char *)&local_140,(FileDescriptor **)0x124f7be);
      if (local_120[0] != '\0') {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_118._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118._M_head_impl);
        }
        InternalFeatureHelper::
        GetResolvedFeatureExtension<google::protobuf::FileDescriptor,pb::TestFeatures,(unsigned_char)11,false>
                  ((TestFeatures *)local_120,(InternalFeatureHelper *)local_128,
                   (FileDescriptor *)&pb::test,extension);
        local_148._0_4_ = local_110._impl_.enum_feature_;
        local_130.data_._0_4_ = 0xe;
        testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                  ((internal *)&local_140,"ext.enum_feature()","pb::EnumFeature::VALUE14",
                   (EnumFeature *)local_148,(EnumFeature *)&local_130);
        if (local_140._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_148);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_138._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = ((_Alloc_hider *)&(local_138._M_head_impl)->field_0x0)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                     ,0xaa,pcVar3);
          testing::internal::AssertHelper::operator=(&local_130,(Message *)local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_138._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138._M_head_impl);
        }
        local_148._0_4_ = local_110._impl_.field_feature_;
        local_130.data_._0_4_ = 0xf;
        testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                  ((internal *)&local_140,"ext.field_feature()","pb::EnumFeature::VALUE15",
                   (EnumFeature *)local_148,(EnumFeature *)&local_130);
        if (local_140._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_148);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_138._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar4 = ((_Alloc_hider *)&(local_138._M_head_impl)->field_0x0)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                     ,0xab,pcVar4);
          testing::internal::AssertHelper::operator=(&local_130,(Message *)local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_138._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138._M_head_impl);
        }
        local_148._0_4_ = local_110._impl_.file_feature_;
        local_130.data_._0_4_ = 6;
        testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                  ((internal *)&local_140,"ext.file_feature()","pb::EnumFeature::VALUE6",
                   (EnumFeature *)local_148,(EnumFeature *)&local_130);
        if (local_140._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_148);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_138._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar4 = ((_Alloc_hider *)&(local_138._M_head_impl)->field_0x0)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                     ,0xac,pcVar4);
          testing::internal::AssertHelper::operator=(&local_130,(Message *)local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_138._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138._M_head_impl);
        }
        local_148._0_4_ = local_110._impl_.source_feature_;
        local_130.data_._0_4_ = 5;
        testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
                  ((internal *)&local_140,"ext.source_feature()","pb::EnumFeature::VALUE5",
                   (EnumFeature *)local_148,(EnumFeature *)&local_130);
        if (local_140._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_148);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_138._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar4 = ((_Alloc_hider *)&(local_138._M_head_impl)->field_0x0)->_M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                     ,0xad,pcVar4);
          testing::internal::AssertHelper::operator=(&local_130,(Message *)local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          if ((long *)CONCAT44(local_148._4_4_,local_148._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_148._4_4_,local_148._0_4_) + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_138._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138._M_head_impl);
        }
        pb::TestFeatures::~TestFeatures((TestFeatures *)local_120);
        goto LAB_0074f437;
      }
      testing::Message::Message((Message *)&local_140);
      if (local_118._M_head_impl ==
          (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = *(char **)local_118._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/internal_feature_helper_test.cc"
                 ,0xa6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)&local_140);
    }
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
         )local_140._M_head_impl !=
        (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
         *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
    if ((tuple<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
         )local_118._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
         )0x0) goto LAB_0074f437;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_118;
    __ptr_00._M_head_impl = local_118._M_head_impl;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_head_impl);
LAB_0074f437:
  FeatureSetDefaults::~FeatureSetDefaults(&local_50);
  return;
}

Assistant:

TEST_F(InternalFeatureHelperTest,
       GetResolvedSourceFeatureExtensionEditedDefaults) {
  FeatureSetDefaults defaults = ParseTextOrDie(R"pb(
    minimum_edition: EDITION_PROTO2
    maximum_edition: EDITION_2024
    defaults {
      edition: EDITION_LEGACY
      overridable_features {}
      fixed_features {
        field_presence: EXPLICIT
        enum_type: CLOSED
        repeated_field_encoding: EXPANDED
        utf8_validation: NONE
        message_encoding: LENGTH_PREFIXED
        json_format: LEGACY_BEST_EFFORT
        enforce_naming_style: STYLE_LEGACY
        default_symbol_visibility: EXPORT_ALL
      }
    }
    defaults {
      edition: EDITION_2023
      overridable_features {
        field_presence: EXPLICIT
        enum_type: OPEN
        repeated_field_encoding: PACKED
        utf8_validation: VERIFY
        message_encoding: LENGTH_PREFIXED
        json_format: ALLOW
        [pb.test] {
          file_feature: VALUE3
          field_feature: VALUE15
          enum_feature: VALUE14
          source_feature: VALUE1
        }
      }
      fixed_features {
        enforce_naming_style: STYLE_LEGACY
        default_symbol_visibility: EXPORT_ALL
      }
    }
  )pb");
  ASSERT_OK(pool_.SetFeatureSetDefaults(defaults));

  ASSERT_THAT(BuildFile(DescriptorProto::descriptor()->file()), NotNull());
  ASSERT_THAT(BuildFile(pb::TestMessage::descriptor()->file()), NotNull());
  auto file = BuildFile(R"schema(
    edition = "2023";
    package proto2_unittest;

    import "google/protobuf/unittest_features.proto";

    option features.(pb.test).file_feature = VALUE6;
    option features.(pb.test).source_feature = VALUE5;
  )schema");
  ASSERT_THAT(file, NotNull());
  const pb::TestFeatures& ext =
      GetResolvedSourceFeatureExtension(*file, pb::test);

  EXPECT_EQ(ext.enum_feature(), pb::EnumFeature::VALUE14);
  EXPECT_EQ(ext.field_feature(), pb::EnumFeature::VALUE15);
  EXPECT_EQ(ext.file_feature(), pb::EnumFeature::VALUE6);
  EXPECT_EQ(ext.source_feature(), pb::EnumFeature::VALUE5);
}